

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileProfilingData.cxx
# Opt level: O3

void __thiscall
cmMakefileProfilingData::RAII::RAII
          (RAII *this,cmMakefileProfilingData *data,string *category,string *name,
          optional<Json::Value> *args)

{
  bool bVar1;
  optional<Json::Value> local_50;
  
  this->Data = data;
  local_50.super__Optional_base<Json::Value,_false,_false>._M_payload.
  super__Optional_payload<Json::Value,_true,_false,_false>.super__Optional_payload_base<Json::Value>
  ._M_engaged = false;
  bVar1 = (args->super__Optional_base<Json::Value,_false,_false>)._M_payload.
          super__Optional_payload<Json::Value,_true,_false,_false>.
          super__Optional_payload_base<Json::Value>._M_engaged == true;
  if (bVar1) {
    Json::Value::Value((Value *)&local_50,(Value *)args);
  }
  local_50.super__Optional_base<Json::Value,_false,_false>._M_payload.
  super__Optional_payload<Json::Value,_true,_false,_false>.super__Optional_payload_base<Json::Value>
  ._M_engaged = bVar1;
  StartEntry(data,category,name,&local_50);
  if (local_50.super__Optional_base<Json::Value,_false,_false>._M_payload.
      super__Optional_payload<Json::Value,_true,_false,_false>.
      super__Optional_payload_base<Json::Value>._M_engaged == true) {
    local_50.super__Optional_base<Json::Value,_false,_false>._M_payload.
    super__Optional_payload<Json::Value,_true,_false,_false>.
    super__Optional_payload_base<Json::Value>._M_engaged = false;
    Json::Value::~Value((Value *)&local_50);
  }
  return;
}

Assistant:

cmMakefileProfilingData::RAII::RAII(cmMakefileProfilingData& data,
                                    const std::string& category,
                                    const std::string& name,
                                    cm::optional<Json::Value> args)
  : Data(&data)
{
  this->Data->StartEntry(category, name, std::move(args));
}